

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O1

string * __thiscall
absl::lts_20250127::strings_internal::
JoinAlgorithm<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,absl::lts_20250127::strings_internal::AlphaNumFormatterImpl>
          (string *__return_storage_ptr__,strings_internal *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> start,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,string_view s,
          AlphaNumFormatterImpl *f)

{
  char *buffer;
  Nonnull<char_*> pcVar1;
  char *pcVar2;
  AlphaNum local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (strings_internal *)start._M_current) {
    buffer = local_60.digits_;
    pcVar2 = "";
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar2);
      pcVar1 = numbers_internal::FastIntToBuffer(*(int32_t *)this,buffer);
      local_60.piece_._M_len = (long)pcVar1 - (long)buffer;
      local_60.piece_._M_str = buffer;
      StrAppend(__return_storage_ptr__,&local_60);
      this = this + 4;
      pcVar2 = (char *)s._M_len;
    } while (this != (strings_internal *)start._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          Formatter&& f) {
  std::string result;
  absl::string_view sep("");
  for (Iterator it = start; it != end; ++it) {
    result.append(sep.data(), sep.size());
    f(&result, *it);
    sep = s;
  }
  return result;
}